

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O0

bool __thiscall
tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::get_sample_at
          (TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *this,double t,Sample **dst)

{
  bool bVar1;
  reference pSVar2;
  __normal_iterator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>_>
  local_50;
  double *local_48;
  Sample *local_40;
  __normal_iterator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>_>
  local_38;
  __normal_iterator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>_>
  local_30;
  __normal_iterator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>_>
  it;
  Sample **dst_local;
  double t_local;
  TypedTimeSamples<std::vector<int,_std::allocator<int>_>_> *this_local;
  
  if (dst != (Sample **)0x0) {
    it._M_current = (Sample *)dst;
    dst_local = (Sample **)t;
    t_local = (double)this;
    if ((this->_dirty & 1U) != 0) {
      update(this);
    }
    local_38._M_current =
         (Sample *)
         std::
         vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
         ::begin(&this->_samples);
    local_40 = (Sample *)
               std::
               vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
               ::end(&this->_samples);
    local_48 = (double *)&dst_local;
    local_30 = std::
               find_if<__gnu_cxx::__normal_iterator<tinyusdz::TypedTimeSamples<std::vector<int,std::allocator<int>>>::Sample*,std::vector<tinyusdz::TypedTimeSamples<std::vector<int,std::allocator<int>>>::Sample,std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,std::allocator<int>>>::Sample>>>,tinyusdz::TypedTimeSamples<std::vector<int,std::allocator<int>>>::get_sample_at(double,tinyusdz::TypedTimeSamples<std::vector<int,std::allocator<int>>>::Sample**)::_lambda(tinyusdz::TypedTimeSamples<std::vector<int,std::allocator<int>>>::Sample_const&)_1_>
                         (local_38,(__normal_iterator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>_>
                                    )local_40,(anon_class_8_1_54a39814_for__M_pred)local_48);
    local_50._M_current =
         (Sample *)
         std::
         vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>
         ::end(&this->_samples);
    bVar1 = __gnu_cxx::operator!=(&local_30,&local_50);
    if (bVar1) {
      pSVar2 = __gnu_cxx::
               __normal_iterator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample_*,_std::vector<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample,_std::allocator<tinyusdz::TypedTimeSamples<std::vector<int,_std::allocator<int>_>_>::Sample>_>_>
               ::operator*(&local_30);
      (it._M_current)->t = (double)pSVar2;
    }
  }
  return false;
}

Assistant:

bool get_sample_at(const double t, Sample **dst) {
    if (!dst) {
      return false;
    }

    if (_dirty) {
      update();
    }

    const auto it = std::find_if(_samples.begin(), _samples.end(), [&t](const Sample &sample) {
      return math::is_close(t, sample.t);
    });

    if (it != _samples.end()) {
      (*dst) = &(*it); 
    }
    return false;
  }